

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmhttpreq.cpp
# Opt level: O0

void new_parsed_str(vm_val_t *ret,char *str,size_t len,int encmode)

{
  vm_obj_id_t obj;
  int iVar1;
  uint uVar2;
  CVmObject *this;
  char *buf_00;
  char *pcVar3;
  int in_ECX;
  void *in_RDX;
  void *in_RSI;
  vm_val_t *in_RDI;
  int c;
  char *bufend;
  char *buf;
  CVmObjString *s;
  char *dst;
  char *src;
  size_t in_stack_ffffffffffffff98;
  undefined4 in_stack_ffffffffffffffa0;
  uint in_stack_ffffffffffffffa4;
  int in_stack_ffffffffffffffb4;
  char *local_48;
  char *local_30;
  char *local_28;
  undefined4 in_stack_ffffffffffffffe0;
  
  obj = CVmObjString::create
                  (in_stack_ffffffffffffffb4,(char *)in_RDI,
                   CONCAT44(in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0));
  vm_val_t::set_obj(in_RDI,obj);
  this = vm_objp(0);
  buf_00 = CVmObjString::cons_get_buf((CVmObjString *)this);
  local_48 = buf_00 + (long)in_RDX;
  local_30 = buf_00;
  local_28 = buf_00;
  if ((in_ECX == 1) || (in_ECX == 2)) {
    while (local_28 < local_48) {
      if ((((*local_28 == '%') && (local_28 + 2 < local_48)) &&
          (iVar1 = is_xdigit(L'\0'), iVar1 != 0)) && (iVar1 = is_xdigit(L'\0'), iVar1 != 0)) {
        iVar1 = value_of_xdigit((int)local_28[1]);
        in_stack_ffffffffffffffa4 = iVar1 << 4;
        uVar2 = value_of_xdigit((int)local_28[2]);
        uVar2 = in_stack_ffffffffffffffa4 | uVar2;
        pcVar3 = local_28 + 3;
        if (((uVar2 == 0xd) && (local_28 + 5 < local_48)) &&
           (iVar1 = memicmp(in_RSI,in_RDX,CONCAT44(in_ECX,in_stack_ffffffffffffffe0)), iVar1 == 0))
        {
          uVar2 = 10;
          pcVar3 = local_28 + 6;
        }
        local_28 = pcVar3;
        *local_30 = (char)uVar2;
        local_30 = local_30 + 1;
      }
      else {
        if ((*local_28 == '+') && ((in_ECX == 2 || (in_ECX == 1)))) {
          *local_30 = ' ';
          local_30 = local_30 + 1;
        }
        else if (((*local_28 != '\r') && (*local_28 != '\n')) || (in_ECX != 2)) {
          *local_30 = *local_28;
          local_30 = local_30 + 1;
        }
        local_28 = local_28 + 1;
      }
    }
    local_48 = local_30;
    CVmObjString::cons_set_len
              ((CVmObjString *)CONCAT44(in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0),
               in_stack_ffffffffffffff98);
  }
  CCharmapToUni::validate(buf_00,(long)local_48 - (long)buf_00);
  return;
}

Assistant:

static void new_parsed_str(VMG_ vm_val_t *ret, const char *str, size_t len,
                           int encmode)
{
    char *src, *dst;

    /* create the raw string */
    ret->set_obj(CVmObjString::create(vmg_ FALSE, str, len));
    CVmObjString *s = (CVmObjString *)vm_objp(vmg_ ret->val.obj);

    /* get the string buffer */
    char *buf = s->cons_get_buf();
    char *bufend = buf + len;

    /* 
     *   if desired, decode url-encoding: run through the string, converting
     *   '%xx' sequences to bytes, and '+' characters to spaces
     */
    if (encmode == ENCMODE_URL || encmode == ENCMODE_FORM)
    {
        for (src = dst = buf ; src < bufend ; )
        {
            /* if this is a '%xx' sequence, convert it */
            if (*src == '%' && src + 2 < bufend
                && is_xdigit(*(src+1)) && is_xdigit(*(src+2)))
            {
                /* generate the character value */
                int c = (value_of_xdigit(*(src+1)) << 4)
                        | value_of_xdigit(*(src+2));

                /* skip the three-character %xx sequence */
                src += 3;

                /* 
                 *   if this is an encoded CR, and an LF follows, decode the
                 *   whole sequence to a single '\n' 
                 */
                if (c == '\r'
                    && src + 2 < bufend
                    && memicmp(src, "%0a", 3) == 0)
                {
                    /* change to '\n' */
                    c = '\n';

                    /* skip the in the source */
                    src += 3;
                }
                
                /* set the character in the output */
                *dst++ = (char)(unsigned char)c;
            }
            else if (*src == '+'
                     && (encmode == ENCMODE_FORM || encmode == ENCMODE_URL))
            {
                /* for form data, translate + to space */
                *dst++ = ' ';
                ++src;
            }
            else if ((*src == '\r' || *src == '\n')
                     && encmode == ENCMODE_FORM)
            {
                /* for form data, strip out newlines */
                ++src;
            }
            else
            {
                /* ordinary character - copy as-is */
                *dst++ = *src++;
            }
        }
        
        /* 
         *   update the length - the string might have contracted, since
         *   '%xx' sequences might have turned into single bytes 
         */
        len = dst - buf;
        bufend = dst;
        s->cons_set_len(len);
    }
    else if (encmode == ENCMODE_MIME)
    {
        // $$$ decode the MIME ?= encoding
    }

    /* ensure that the buffer has only well-formed UTF-8 characters */
    CCharmapToUni::validate(buf, bufend - buf);
}